

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O2

void __thiscall
icu_63::SimpleTimeZone::setStartRule
          (SimpleTimeZone *this,int32_t month,int32_t dayOfMonth,int32_t dayOfWeek,int32_t time,
          TimeMode mode,UBool after,UErrorCode *status)

{
  if (after == '\0') {
    dayOfMonth = -dayOfMonth;
  }
  setStartRule(this,month,dayOfMonth,-dayOfWeek,time,mode,status);
  return;
}

Assistant:

void 
SimpleTimeZone::setStartRule(int32_t month, int32_t dayOfMonth, int32_t dayOfWeek, 
                             int32_t time, TimeMode mode, UBool after, UErrorCode& status)
{
    setStartRule(month, after ? dayOfMonth : -dayOfMonth,
                 -dayOfWeek, time, mode, status);
}